

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdatabase.cpp
# Opt level: O3

void parseFontName(QString *name,QString *foundry,QString *family)

{
  char16_t cVar1;
  QArrayData *pQVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  Data *pDVar5;
  uint uVar6;
  qsizetype qVar7;
  ulong uVar8;
  wchar32 wVar9;
  uint uVar10;
  long lVar11;
  int iVar12;
  long in_FS_OFFSET;
  QStringView QVar13;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d.ptr = (name->d).ptr;
  local_58.d.d = (Data *)(name->d).size;
  qVar7 = QStringView::indexOf((QStringView *)&local_58,(QChar)0x5b,0,CaseSensitive);
  QVar13.m_data = (name->d).ptr;
  QVar13.m_size = (name->d).size;
  uVar6 = QtPrivate::lastIndexOf(QVar13,-1,L']',CaseSensitive);
  uVar10 = (uint)qVar7;
  if (((int)uVar10 < (int)uVar6) && (((uVar6 | uVar10) & 0x80000000) == 0)) {
    QString::mid((longlong)&local_58,(longlong)name);
    pQVar2 = &((foundry->d).d)->super_QArrayData;
    pcVar3 = (foundry->d).ptr;
    (foundry->d).d = local_58.d.d;
    (foundry->d).ptr = local_58.d.ptr;
    qVar4 = (foundry->d).size;
    (foundry->d).size = local_58.d.size;
    local_58.d.d = (Data *)pQVar2;
    local_58.d.ptr = pcVar3;
    local_58.d.size = qVar4;
    if (pQVar2 != (QArrayData *)0x0) {
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar2,2,0x10);
      }
    }
    if ((int)uVar10 < 1) {
      uVar8 = 0;
    }
    else {
      uVar6 = (uint)(qVar7 + 0xffffffffU);
      if ((name->d).ptr[qVar7 + 0xffffffffU & 0xffffffff] != L' ') {
        uVar6 = uVar10;
      }
      uVar8 = (ulong)uVar6;
    }
    QString::left(&local_58,name,uVar8);
    pQVar2 = &((family->d).d)->super_QArrayData;
    pcVar3 = (family->d).ptr;
    *(undefined4 *)&(family->d).d = local_58.d.d._0_4_;
    *(undefined4 *)((long)&(family->d).d + 4) = local_58.d.d._4_4_;
    *(undefined4 *)&(family->d).ptr = local_58.d.ptr._0_4_;
    *(undefined4 *)((long)&(family->d).ptr + 4) = local_58.d.ptr._4_4_;
    qVar7 = (family->d).size;
    (family->d).size = local_58.d.size;
    local_58.d.d = (Data *)pQVar2;
    local_58.d.ptr = pcVar3;
    local_58.d.size = qVar7;
    if (pQVar2 != (QArrayData *)0x0) {
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar2,2,0x10);
      }
    }
  }
  else {
    if ((foundry->d).ptr != (char16_t *)0x0) {
      pQVar2 = &((foundry->d).d)->super_QArrayData;
      (foundry->d).d = (Data *)0x0;
      (foundry->d).ptr = (char16_t *)0x0;
      (foundry->d).size = 0;
      if (pQVar2 != (QArrayData *)0x0) {
        LOCK();
        (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar2,2,0x10);
        }
      }
    }
    QString::operator=(family,(QString *)name);
  }
  pDVar5 = (family->d).d;
  if ((pDVar5 == (Data *)0x0) ||
     (1 < (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QString::reallocData((longlong)family,(AllocationOption)(family->d).size);
  }
  iVar12 = (int)(family->d).size;
  if (iVar12 != 0) {
    pcVar3 = (family->d).ptr;
    uVar8 = 1;
    lVar11 = 0;
    do {
      cVar1 = pcVar3[lVar11];
      uVar6 = (uint)(ushort)cVar1;
      if ((uVar8 & 1) != 0) {
        uVar6 = QChar::toUpper((uint)(ushort)cVar1);
        pcVar3[lVar11] = (char16_t)uVar6;
      }
      if ((0x17 < (ushort)(uVar6 - 9)) || (uVar8 = 1, (0x80001fU >> (uVar6 - 9 & 0x1f) & 1) == 0)) {
        wVar9 = uVar6 & 0xffff;
        if ((uint)wVar9 < 0x80) {
          uVar8 = 0;
        }
        else {
          uVar8 = 1;
          if ((wVar9 != L'\x85') && (wVar9 != L'\xa0')) {
            uVar8 = QChar::isSpace_helper(wVar9);
          }
        }
      }
      lVar11 = lVar11 + 1;
    } while (iVar12 != (int)lVar11);
  }
  pDVar5 = (foundry->d).d;
  if ((pDVar5 == (Data *)0x0) ||
     (1 < (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QString::reallocData((longlong)foundry,(AllocationOption)(foundry->d).size);
  }
  iVar12 = (int)(foundry->d).size;
  if (iVar12 != 0) {
    pcVar3 = (foundry->d).ptr;
    uVar8 = 1;
    lVar11 = 0;
    do {
      cVar1 = pcVar3[lVar11];
      uVar6 = (uint)(ushort)cVar1;
      if ((uVar8 & 1) != 0) {
        uVar6 = QChar::toUpper((uint)(ushort)cVar1);
        pcVar3[lVar11] = (char16_t)uVar6;
      }
      if ((0x17 < (ushort)(uVar6 - 9)) || (uVar8 = 1, (0x80001fU >> (uVar6 - 9 & 0x1f) & 1) == 0)) {
        wVar9 = uVar6 & 0xffff;
        if ((uint)wVar9 < 0x80) {
          uVar8 = 0;
        }
        else {
          uVar8 = 1;
          if ((wVar9 != L'\x85') && (wVar9 != L'\xa0')) {
            uVar8 = QChar::isSpace_helper(wVar9);
          }
        }
      }
      lVar11 = lVar11 + 1;
    } while (iVar12 != (int)lVar11);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void parseFontName(const QString &name, QString &foundry, QString &family)
{
    int i = name.indexOf(u'[');
    int li = name.lastIndexOf(u']');
    if (i >= 0 && li >= 0 && i < li) {
        foundry = name.mid(i + 1, li - i - 1);
        if (i > 0 && name[i - 1] == u' ')
            i--;
        family = name.left(i);
    } else {
        foundry.clear();
        family = name;
    }

    // capitalize the family/foundry names
    bool space = true;
    QChar *s = family.data();
    int len = family.size();
    while(len--) {
        if (space) *s = s->toUpper();
        space = s->isSpace();
        ++s;
    }

    space = true;
    s = foundry.data();
    len = foundry.size();
    while(len--) {
        if (space) *s = s->toUpper();
        space = s->isSpace();
        ++s;
    }
}